

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O1

void __thiscall
cfd::capi::CfdCapiManager::CopyHandle
          (CfdCapiManager *this,void *source,void *destination,bool error_state_only)

{
  CfdException *this_00;
  undefined1 local_40 [32];
  
  if (destination != (void *)0x0 && source != (void *)0x0) {
    if ((*(long *)((long)source + 7) != 0x61746144656c64 || *source != 0x646e614869706143) ||
       (*(long *)((long)destination + 7) != 0x61746144656c64 || *destination != 0x646e614869706143))
    {
      local_40._0_8_ = "cfdcapi_common.cpp";
      local_40._8_4_ = 0x187;
      local_40._16_8_ = "CopyHandle";
      core::logger::log<>((CfdSourceLocation *)local_40,kCfdLogLevelWarning,
                          "Illegal handle data. prefix unmatch.");
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      local_40._0_8_ = local_40 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"Illegal handle data.","");
      core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_40);
      __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    if (error_state_only) {
      *(undefined4 *)((long)destination + 0x10) = *(undefined4 *)((long)source + 0x10);
      memcpy((void *)((long)destination + 0x15),(void *)((long)source + 0x15),0x100);
      return;
    }
  }
  return;
}

Assistant:

void CfdCapiManager::CopyHandle(
    void* source, void* destination, bool error_state_only) const {
  if ((source != nullptr) && (destination != nullptr)) {
    CfdCapiHandleData* source_data = static_cast<CfdCapiHandleData*>(source);
    CfdCapiHandleData* dest_data =
        static_cast<CfdCapiHandleData*>(destination);
    size_t len = strlen(kPrefixHandleData) + 1;
    if ((memcmp(source_data->prefix, kPrefixHandleData, len) != 0) ||
        (memcmp(dest_data->prefix, kPrefixHandleData, len) != 0)) {
      warn(CFD_LOG_SOURCE, "Illegal handle data. prefix unmatch.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Illegal handle data.");
    }

    if (error_state_only) {
      dest_data->error_code = source_data->error_code;
      memcpy(
          dest_data->error_message, source_data->error_message,
          sizeof(dest_data->error_message));
    } else {
      // TODO(k-matsuzawa): Currently there is no information to copy
      // bool is_outside = dest_data->is_outside;
      // memcpy(dest_data, source_data, sizeof(CfdCapiHandleData));
      // dest_data->is_outside = is_outside;
    }
  }
}